

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-combiner.c
# Opt level: O3

void logical_or_with_cancel_vec(int n,int *vals,int *auxs,int *accum,int *accum_aux)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  
  *accum = 0x7ffffffe;
  if (n < 1) {
    iVar2 = 0x7ffffffe;
  }
  else {
    uVar3 = 0;
    do {
      logical_or_with_cancel_combine_accum_help(vals[uVar3],accum);
      uVar3 = uVar3 + 1;
    } while ((uint)n != uVar3);
    uVar1 = *accum;
    if ((int)uVar1 < 0x7ffffffe) {
      if ((uVar1 & 2) == 0) {
        if (1 < uVar1) {
          __assert_fail("*accum == 0 || *accum == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-entry-combiner.c"
                        ,0x20b,
                        "void logical_or_with_cancel_vec(int, const int *, const int *, int *, int *)"
                       );
        }
      }
      else {
        *accum = -1;
      }
    }
    *accum_aux = 0x7ffffffe;
    if (n < 1) {
      return;
    }
    uVar3 = 0;
    do {
      logical_or_with_cancel_combine_accum_help(auxs[uVar3],accum_aux);
      uVar3 = uVar3 + 1;
    } while ((uint)n != uVar3);
    uVar1 = *accum_aux;
    if (0x7ffffffd < (int)uVar1) {
      return;
    }
    iVar2 = -1;
    if ((uVar1 & 2) == 0) {
      if (uVar1 < 2) {
        return;
      }
      __assert_fail("*accum_aux == 0 || *accum_aux == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-entry-combiner.c"
                    ,0x218,
                    "void logical_or_with_cancel_vec(int, const int *, const int *, int *, int *)");
    }
  }
  *accum_aux = iVar2;
  return;
}

Assistant:

static void logical_or_with_cancel_vec(int n, const int *vals, const int *auxs,
	int *accum, int *accum_aux)
{
	int i;

	*accum = UI_ENTRY_VALUE_NOT_PRESENT;
	for (i = 0; i < n; ++i) {
		logical_or_with_cancel_combine_accum_help(vals[i], accum);
	}
	if (*accum != UI_ENTRY_UNKNOWN_VALUE &&
		*accum != UI_ENTRY_VALUE_NOT_PRESENT) {
		if ((*accum & 2) != 0) {
			*accum = -1;
		} else {
			assert(*accum == 0 || *accum == 1);
		}
	}

	*accum_aux = UI_ENTRY_VALUE_NOT_PRESENT;
	for (i = 0; i < n; ++i) {
		logical_or_with_cancel_combine_accum_help(auxs[i], accum_aux);
	}
	if (*accum_aux != UI_ENTRY_UNKNOWN_VALUE &&
		*accum_aux != UI_ENTRY_VALUE_NOT_PRESENT) {
		if ((*accum_aux & 2) != 0) {
			*accum_aux = -1;
		} else {
			assert(*accum_aux == 0 || *accum_aux == 1);
		}
	}
}